

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void upb_Arena_Free(upb_Arena *a)

{
  char *pcVar1;
  code *pcVar2;
  long *plVar3;
  upb_Arena *puVar4;
  upb_Arena *puVar5;
  undefined8 *puVar6;
  long *plVar7;
  upb_Arena *puVar8;
  bool bVar9;
  
  puVar5 = (upb_Arena *)a[2].ptr_dont_copy_me__upb_internal_use_only;
  puVar8 = a + 1;
  while( true ) {
    while (puVar4 = puVar5, ((ulong)puVar4 & 1) == 0) {
      puVar8 = puVar4;
      puVar5 = (upb_Arena *)puVar4[1].ptr_dont_copy_me__upb_internal_use_only;
    }
    if (puVar4 == (upb_Arena *)0x3) break;
    LOCK();
    puVar5 = (upb_Arena *)puVar8[1].ptr_dont_copy_me__upb_internal_use_only;
    bVar9 = puVar4 == puVar5;
    if (bVar9) {
      puVar8[1].ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar4[-1].end_dont_copy_me__upb_internal_use_only + 6);
      puVar5 = puVar4;
    }
    UNLOCK();
    if (bVar9) {
      return;
    }
  }
  if (((ulong)puVar8[1].ptr_dont_copy_me__upb_internal_use_only & 1) == 0) {
    __assert_fail("_upb_Arena_IsTaggedRefcount(parent_or_count)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                  ,0x70,"uintptr_t _upb_Arena_RefCountFromTagged(uintptr_t)");
  }
  if (((ulong)puVar8[1].ptr_dont_copy_me__upb_internal_use_only & 0xfffffffffffffffe) == 2) {
    do {
      if (puVar8 == (upb_Arena *)0x0) {
        return;
      }
      puVar5 = (upb_Arena *)puVar8[1].end_dont_copy_me__upb_internal_use_only;
      pcVar1 = puVar8->ptr_dont_copy_me__upb_internal_use_only;
      plVar7 = (long *)puVar8[2].end_dont_copy_me__upb_internal_use_only;
      if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
        plVar7[1] = (long)puVar8[-1].end_dont_copy_me__upb_internal_use_only - (long)plVar7;
      }
      puVar6 = (undefined8 *)((ulong)pcVar1 & 0xfffffffffffffffe);
      pcVar2 = (code *)puVar8->end_dont_copy_me__upb_internal_use_only;
      if (plVar7 != (long *)0x0) {
        if (puVar6 == (undefined8 *)0x0) {
          __assert_fail("alloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/alloc.h"
                        ,0x36,"void upb_free_sized(upb_alloc *, void *, size_t)");
        }
        do {
          plVar3 = (long *)*plVar7;
          (*(code *)*puVar6)(puVar6,plVar7,plVar7[1],0);
          plVar7 = plVar3;
        } while (plVar3 != (long *)0x0);
      }
      puVar8 = puVar5;
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(puVar6);
      }
    } while( true );
  }
  __assert_fail("_upb_Arena_RefCountFromTagged(ai->parent_or_count) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                ,0x1d8,"void _upb_Arena_DoFree(upb_ArenaInternal *)");
}

Assistant:

void upb_Arena_Free(upb_Arena* a) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  // Cannot be replaced with _upb_Arena_FindRoot, as that provides only a
  // relaxed read of the refcount if ai is already the root.
  uintptr_t poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
retry:
  while (_upb_Arena_IsTaggedPointer(poc)) {
    ai = _upb_Arena_PointerFromTagged(poc);
    UPB_TSAN_CHECK_PUBLISHED(ai);
    poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
  }

  // compare_exchange or fetch_sub are RMW operations, which are more
  // expensive then direct loads.  As an optimization, we only do RMW ops
  // when we need to update things for other threads to see.
  if (poc == _upb_Arena_TaggedFromRefcount(1)) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogFree(a);
#endif
    _upb_Arena_DoFree(ai);
    return;
  }

  if (upb_Atomic_CompareExchangeWeak(
          &ai->parent_or_count, &poc,
          _upb_Arena_TaggedFromRefcount(_upb_Arena_RefCountFromTagged(poc) - 1),
          memory_order_release, memory_order_acquire)) {
    // We were >1 and we decremented it successfully, so we are done.
    return;
  }

  // We failed our update, so someone has done something, retry the whole
  // process, but the failed exchange reloaded `poc` for us.
  goto retry;
}